

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

bool __thiscall MP1Node::recvMembershipList(MP1Node *this,void *env,char *data,int size,char *label)

{
  short port;
  int id;
  long heartbeat;
  int iVar1;
  long lVar2;
  long *plVar3;
  
  lVar2 = *(long *)data;
  iVar1 = (int)lVar2 * 0xe;
  if (0 < lVar2 && iVar1 <= size + -8) {
    plVar3 = (long *)(data + 0xe);
    do {
      id = *(int *)((long)plVar3 + -6);
      port = *(short *)((long)plVar3 + -2);
      heartbeat = *plVar3;
      Params::getcurrtime(this->par);
      updateMembershipList(this,id,port,heartbeat);
      plVar3 = (long *)((long)plVar3 + 0xe);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return iVar1 <= size + -8;
}

Assistant:

bool MP1Node::recvMembershipList(void *env, char *data, int size, const char * label) {

    //get the number of members
    long numberOfMembers;
    memcpy(&numberOfMembers, data, sizeof(long));
    data += sizeof(long);
    size -= sizeof(long);

    if (size < (int)(numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)))) {
        return false;
    }

    //extract each member from data and update own membership list
    MemberListEntry entry;
    for (int i = 0; i < numberOfMembers; i++) {

        memcpy(&entry.id, data, sizeof(int));
        data += sizeof(int);
        memcpy(&entry.port, data, sizeof(short));
        data += sizeof(short);
        memcpy(&entry.heartbeat, data, sizeof(long));
        data += sizeof(long);
        entry.timestamp = par->getcurrtime();

        int id = entry.id;
        short port = entry.port;
        long heartbeat = entry.heartbeat;

        updateMembershipList(id, port, heartbeat);
    }

    return true;
}